

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

cmNinjaTargetGenerator * cmNinjaTargetGenerator::New(cmGeneratorTarget *target)

{
  TargetType TVar1;
  cmGeneratorTarget *target_local;
  
  TVar1 = cmGeneratorTarget::GetType(target);
  if (TVar1 < UTILITY) {
    target_local = (cmGeneratorTarget *)operator_new(0x260);
    cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
              ((cmNinjaNormalTargetGenerator *)target_local,target);
  }
  else if (TVar1 - UTILITY < 2) {
    target_local = (cmGeneratorTarget *)operator_new(0x180);
    cmNinjaUtilityTargetGenerator::cmNinjaUtilityTargetGenerator
              ((cmNinjaUtilityTargetGenerator *)target_local,target);
  }
  else {
    target_local = (cmGeneratorTarget *)0x0;
  }
  return (cmNinjaTargetGenerator *)target_local;
}

Assistant:

cmNinjaTargetGenerator* cmNinjaTargetGenerator::New(cmGeneratorTarget* target)
{
  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      return new cmNinjaNormalTargetGenerator(target);

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
      return new cmNinjaUtilityTargetGenerator(target);

    default:
      return CM_NULLPTR;
  }
}